

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O0

void __thiscall
NaPetriNet::link_1n(NaPetriNet *this,NaPetriConnector *pcSrc,NaPetriConnector *pcDst1,...)

{
  char in_AL;
  undefined4 *puVar1;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  NaException exCode;
  char *szExMsg;
  va_list val;
  NaPetriConnector *pcDst;
  long *local_168;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  char *local_40;
  uint local_38;
  undefined4 local_34;
  long *local_30;
  undefined1 *local_28;
  long local_20;
  long local_18;
  long local_10;
  long *local_8;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_40 = "Broken link from \'%s.%s\' to \'%s.%s\'.\nCaused by exception: %s\n";
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RSI == 0) {
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0;
    __cxa_throw(puVar1,&NaException::typeinfo,0);
  }
  local_28 = local_108;
  local_30 = (long *)&stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x18;
  local_20 = in_RDX;
  while (local_20 != 0) {
    (**(code **)(*in_RDI + 0x40))(in_RDI,local_10,local_20);
    if (local_38 < 0x29) {
      local_168 = (long *)(local_28 + (int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      local_168 = local_30;
      local_30 = local_30 + 1;
    }
    local_20 = *local_168;
  }
  return;
}

Assistant:

void
NaPetriNet::link_1n (NaPetriConnector* pcSrc, NaPetriConnector* pcDst1, ...)
{
  NaPetriConnector	*pcDst;
  va_list		val;
  const char		*szExMsg =
    "Broken link from '%s.%s' to '%s.%s'.\n"
    "Caused by exception: %s\n";

  if(NULL == pcSrc)
    throw(na_null_pointer);

  for(pcDst = pcDst1, va_start(val, pcDst1);
      NULL != pcDst;
      pcDst = va_arg(val, NaPetriConnector*)){
    try{
      link(pcSrc, pcDst);
    }catch(NaException exCode){
      NaPrintLog(szExMsg,
		 pcSrc->host()->name(), pcSrc->name(),
		 pcDst->host()->name(), pcDst->name(),
		 NaExceptionMsg(exCode));
    }
  }

  va_end(val);
}